

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFutureProofing.cpp
# Opt level: O2

bool anon_unknown.dwarf_1bacb1::checkPixels<Imath_3_2::half>
               (Array2D<unsigned_int> *sampleCount,Array2D<Imath_3_2::half_*> *ph,int lx,int rx,
               int ly,int ry,int width)

{
  float *pfVar1;
  ulong uVar2;
  ostream *poVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  half local_5e;
  int local_5c;
  float local_58;
  float local_54;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  
  local_48 = (long)lx;
  lVar4 = (long)rx;
  lVar5 = (long)ly;
  local_50 = (long)ry;
  local_40 = lVar4;
  do {
    if (local_50 < lVar5) {
LAB_00168979:
      return local_50 < lVar5;
    }
    local_38 = lVar5 * (ulong)(uint)width;
    for (lVar7 = local_48; lVar7 <= lVar4; lVar7 = lVar7 + 1) {
      local_5c = ((int)local_38 + (int)lVar7) % 0x801;
      local_58 = (float)local_5c;
      uVar2 = 0;
      while (uVar6 = uVar2, uVar6 < sampleCount->_data[sampleCount->_sizeY * lVar5 + lVar7]) {
        local_54 = *(float *)(_imath_half_to_float_table +
                             (ulong)ph->_data[ph->_sizeY * lVar5 + lVar7][uVar6]._h * 4);
        Imath_3_2::half::half(&local_5e,local_58);
        pfVar1 = (float *)(_imath_half_to_float_table + (ulong)local_5e._h * 4);
        if ((local_54 != *pfVar1) || (uVar2 = uVar6 + 1, NAN(local_54) || NAN(*pfVar1))) {
          poVar3 = std::operator<<((ostream *)&std::cout,"value at ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)lVar7);
          poVar3 = std::operator<<(poVar3,", ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)lVar5);
          poVar3 = std::operator<<(poVar3,", sample ");
          poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
          poVar3 = std::operator<<(poVar3,": ");
          poVar3 = (ostream *)
                   ::operator<<(poVar3,(half)ph->_data[ph->_sizeY * lVar5 + lVar7][uVar6]._h);
          poVar3 = std::operator<<(poVar3,", should be ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_5c);
          std::endl<char,std::char_traits<char>>(poVar3);
          std::ostream::flush();
          goto LAB_00168979;
        }
      }
      lVar4 = local_40;
    }
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

bool
checkPixels (
    Array2D<unsigned int>& sampleCount,
    Array2D<T*>&           ph,
    int                    lx,
    int                    rx,
    int                    ly,
    int                    ry,
    int                    width)
{
    for (int y = ly; y <= ry; ++y)
    {
        for (int x = lx; x <= rx; ++x)
        {
            for (unsigned int i = 0; i < sampleCount[y][x]; i++)
            {
                if (ph[y][x][i] != static_cast<T> (((y * width + x) % 2049)))
                {
                    cout << "value at " << x << ", " << y << ", sample " << i
                         << ": " << ph[y][x][i] << ", should be "
                         << (y * width + x) % 2049 << endl
                         << flush;
                    return false;
                }
            }
        }
    }

    return true;
}